

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::FullClassName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc,bool is_descriptor)

{
  long lVar1;
  string *psVar2;
  EnumDescriptor *pEVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  undefined7 in_register_00000011;
  string classname;
  __string_type __str;
  string local_a8;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined4 local_44;
  string *local_40;
  EnumDescriptor *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000011,is_descriptor);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  lVar1 = **(long **)desc;
  local_40 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,lVar1,(*(long **)desc)[1] + lVar1);
  plVar6 = *(long **)(desc + 0x18);
  local_38 = desc;
  if (plVar6 != (long *)0x0) {
    do {
      lVar1 = *(long *)*plVar6;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,lVar1,((long *)*plVar6)[1] + lVar1);
      std::__cxx11::string::_M_replace_aux((ulong)&local_88,local_88._M_string_length,0,'\x01');
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_58 = *plVar7;
        lStack_50 = plVar5[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar7;
        local_68 = (long *)*plVar5;
      }
      local_60 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      plVar6 = (long *)plVar6[3];
    } while (plVar6 != (long *)0x0);
  }
  pEVar3 = local_38;
  ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_88,&local_a8,local_38);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
  psVar2 = local_40;
  plVar5 = plVar6 + 2;
  if ((long *)*plVar6 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar6[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar6;
  }
  local_60 = plVar6[1];
  *plVar6 = (long)plVar5;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  iVar4 = std::__cxx11::string::compare(*(char **)(*(long *)(pEVar3 + 0x10) + 8));
  if (iVar4 == 0) {
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      (psVar2->field_2)._M_allocated_capacity =
           CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,local_a8.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&psVar2->field_2 + 8) = local_a8.field_2._8_8_;
    }
    else {
      (psVar2->_M_dataplus)._M_p = local_a8._M_dataplus._M_p;
      (psVar2->field_2)._M_allocated_capacity =
           CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,local_a8.field_2._M_local_buf[0]);
    }
    psVar2->_M_string_length = local_a8._M_string_length;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    PhpName(&local_88,*(string **)(*(long *)(pEVar3 + 0x10) + 8),local_44._0_1_);
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_88,local_88._M_string_length,0,'\x01');
    plVar5 = plVar6 + 2;
    if ((long *)*plVar6 == plVar5) {
      local_58 = *plVar5;
      lStack_50 = plVar6[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar5;
      local_68 = (long *)*plVar6;
    }
    local_60 = plVar6[1];
    *plVar6 = (long)plVar5;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_68,(ulong)local_a8._M_dataplus._M_p);
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      lVar1 = plVar6[3];
      (psVar2->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&psVar2->field_2 + 8) = lVar1;
    }
    else {
      (psVar2->_M_dataplus)._M_p = (pointer)*plVar6;
      (psVar2->field_2)._M_allocated_capacity = *psVar8;
    }
    psVar2->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return psVar2;
}

Assistant:

std::string FullClassName(const DescriptorType* desc, bool is_descriptor) {
  string classname = desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = containing->name() + '_' + classname;
    containing = containing->containing_type();
  }
  classname = ClassNamePrefix(classname, desc) + classname;

  if (desc->file()->package() == "") {
    return classname;
  } else {
    return PhpName(desc->file()->package(), is_descriptor) + '\\' +
           classname;
  }
}